

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O3

void __thiscall
ProtocolMACEthernet::ProcessRx(ProtocolMACEthernet *this,uint8_t *buffer,int actualLength)

{
  bool bVar1;
  uint16_t uVar2;
  DataBuffer *this_00;
  ulong uVar3;
  uint uVar4;
  
  this_00 = (DataBuffer *)osQueue::Get(&this->RxBufferQueue);
  uVar4 = 0x200;
  if (actualLength < 0x200) {
    uVar4 = actualLength;
  }
  if (this_00 == (DataBuffer *)0x0) {
    puts("ProtocolMACEthernet::ProcessRx Out of receive buffers");
    return;
  }
  DataBuffer::Initialize(this_00,&this->super_InterfaceMAC);
  if (0 < actualLength) {
    uVar3 = 0;
    do {
      this_00->Packet[uVar3] = buffer[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  this_00->Length = (uint16_t)uVar4;
  uVar2 = Unpack16(this_00->Packet,0xc);
  bVar1 = IsLocalAddress(this,this_00->Packet);
  if (bVar1) {
    if (0x200 < actualLength) goto LAB_00106bad;
    this_00->Packet = this_00->Packet + 0xe;
    this_00->Length = this_00->Length - 0xe;
    if (uVar2 == 0x806) {
      ProtocolARP::ProcessRx(this->ARP,this_00);
    }
    else if (uVar2 == 0x800) {
      ProtocolIPv4::ProcessRx(this->IPv4,this_00);
    }
  }
  if (this_00->Disposable != true) {
    return;
  }
LAB_00106bad:
  osQueue::Put(&this->RxBufferQueue,this_00);
  return;
}

Assistant:

void ProtocolMACEthernet::ProcessRx(uint8_t* buffer, int actualLength)
{
    uint16_t type;
    DataBuffer* packet = (DataBuffer*)RxBufferQueue.Get();
    int i;
    int length =
        (DATA_BUFFER_PAYLOAD_SIZE < actualLength ? DATA_BUFFER_PAYLOAD_SIZE : actualLength);

    if (packet == nullptr)
    {
        printf("ProtocolMACEthernet::ProcessRx Out of receive buffers\n");
        return;
    }

    if (length > DATA_BUFFER_PAYLOAD_SIZE)
    {
        // printf("ProtocolMACEthernet::ProcessRx Rx data overrun %d, %d\n",
        //        length,
        //        DATA_BUFFER_PAYLOAD_SIZE);
        RxBufferQueue.Put(packet);
        return;
    }

    packet->Initialize(this);

    for (i = 0; i < length; i++)
    {
        packet->Packet[i] = buffer[i];
    }
    packet->Length = length;

    type = Unpack16(packet->Packet, 12);

    // Check if the MAC Address is destined for me
    if (IsLocalAddress(packet->Packet))
    {
        // DumpData( buffer, length, printf );
        if (actualLength > length)
        {
            // printf("ProtocolMACEthernet::ProcessRx Rx data overrun %d, %d\n",
            //        length,
            //        DATA_BUFFER_PAYLOAD_SIZE);
            // printf("Unicast type 0x%04X\n", type);
            RxBufferQueue.Put(packet);
            return;
        }
        // Unicast
        packet->Packet += header_size();
        packet->Length -= header_size();

        switch (type)
        {
        case 0x0800: // IP
            IPv4.ProcessRx(packet);
            break;
        case 0x0806: // ARP
            ARP.ProcessRx(packet);
            break;
        default:
            // printf( "Unsupported Unicast type 0x%04X\n", type );
            break;
        }
    }

    if (packet->Disposable)
    {
        RxBufferQueue.Put(packet);
    }
}